

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode http_output_bearer(connectdata *conn)

{
  char **ppcVar1;
  char *pcVar2;
  CURLcode local_1c;
  CURLcode result;
  char **userp;
  connectdata *conn_local;
  
  local_1c = CURLE_OK;
  ppcVar1 = &(conn->allocptr).userpwd;
  (*Curl_cfree)(*ppcVar1);
  pcVar2 = curl_maprintf("Authorization: Bearer %s\r\n",conn->oauth_bearer);
  *ppcVar1 = pcVar2;
  if (*ppcVar1 == (char *)0x0) {
    local_1c = CURLE_OUT_OF_MEMORY;
  }
  return local_1c;
}

Assistant:

static CURLcode http_output_bearer(struct connectdata *conn)
{
  char **userp;
  CURLcode result = CURLE_OK;

  userp = &conn->allocptr.userpwd;
  free(*userp);
  *userp = aprintf("Authorization: Bearer %s\r\n",
                   conn->oauth_bearer);

  if(!*userp) {
    result = CURLE_OUT_OF_MEMORY;
    goto fail;
  }

  fail:
  return result;
}